

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void cursespp::SchemaOverlay::ShowBoolOverlay
               (BoolEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  Type TVar1;
  int precision;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  double value;
  uint __val;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  _func_void *p_Var6;
  runtime_error *this_00;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint __len;
  DoubleEntry *doubleEntry;
  long lVar10;
  _Any_data *p_Var11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  anon_class_80_3_1ce9ae6c handler;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  allocator<char> local_13a;
  allocator<char> local_139;
  string local_138;
  long *local_118 [2];
  long local_108 [2];
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Any_data *local_d8 [2];
  _Any_data local_c8;
  code *local_b8;
  long *local_a8 [2];
  long local_98 [2];
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,(entry->entry).name,(allocator<char> *)local_f8);
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"true","");
  p_Var11 = &local_c8;
  pcVar9 = "false";
  local_d8[0] = p_Var11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"false","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)local_118);
  lVar10 = -0x40;
  do {
    if (p_Var11 != *(_Any_data **)(p_Var11 + -1)) {
      operator_delete(*(_Any_data **)(p_Var11 + -1),*(long *)p_Var11 + 1);
    }
    p_Var11 = p_Var11 + -2;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  local_f8._0_8_ =
       (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8._8_8_ =
       (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count + 1;
    }
  }
  local_e8._M_allocated_capacity = (size_type)local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_f8 + 0x10),local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_c8,callback);
  peVar2 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
        goto LAB_00172993;
      }
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    this->_M_use_count = this->_M_use_count + 1;
  }
LAB_00172993:
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,(entry->entry).name,&local_139);
  switch(TVar1) {
  case Bool:
    bVar4 = (**(code **)(*(long *)peVar2 + 0x50))(peVar2,local_a8,entry->defaultValue);
    if (bVar4 != 0) {
      pcVar9 = "true";
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,pcVar9,pcVar9 + ((ulong)bVar4 ^ 5));
    break;
  case Int:
    uVar5 = (**(code **)(*(long *)peVar2 + 0x58))(peVar2,local_a8,entry[1].entry.type);
    __val = -uVar5;
    if (0 < (int)uVar5) {
      __val = uVar5;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar7 = (uint)uVar8;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00172b43;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00172b43;
        }
        if (uVar7 < 10000) goto LAB_00172b43;
        uVar8 = uVar8 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00172b43:
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_138,(char)__len - (char)((int)uVar5 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_138._M_dataplus._M_p + (uVar5 >> 0x1f),__len,__val);
    break;
  case Double:
    precision = *(int *)&entry[1].entry.name;
    value = (double)(**(code **)(*(long *)peVar2 + 0x60))
                              ((int)*(undefined8 *)&entry[1].defaultValue,peVar2,local_a8);
    stringValueForDouble_abi_cxx11_(&local_138,value,precision);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,*(char **)&entry->defaultValue,&local_13a);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_138,peVar2,local_a8,local_118);
    goto LAB_00172aa2;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,entry[1].entry.name,&local_13a);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_138,peVar2,local_a8,local_118);
LAB_00172aa2:
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type passed to stringValueFor!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  p_Var6 = (_func_void *)operator_new(0x50);
  *(undefined8 *)p_Var6 = local_f8._0_8_;
  *(undefined8 *)(p_Var6 + 8) = local_f8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_f8._8_8_ + 8) = *(_Atomic_word *)(local_f8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_f8._8_8_ + 8) = *(_Atomic_word *)(local_f8._8_8_ + 8) + 1;
    }
  }
  *(_func_void **)(p_Var6 + 0x10) = p_Var6 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var6 + 0x10),local_e8._M_allocated_capacity,
             local_e8._8_8_ + local_e8._M_allocated_capacity);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(p_Var6 + 0x30),
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_c8);
  pcStack_70 = std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:283:20)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:283:20)>
             ::_M_manager;
  local_88._M_unused._M_function_pointer = p_Var6;
  ShowListOverlay(&local_68,&local_48,&local_138,
                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if ((_Any_data **)local_e8._M_allocated_capacity != local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,(long)local_d8[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowBoolOverlay(
    const ISchema::BoolEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);
    std::vector<std::string> items = { "true", "false" };

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetBool(name, value == "true");
        if (callback) { callback(value); }
    };

    ShowListOverlay(name, items, stringValueFor(prefs, entry), handler);
}